

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

string * clask::url_encode(string *__return_storage_ptr__,string *value,bool escape_slash)

{
  uint *puVar1;
  long lVar2;
  pointer pcVar3;
  size_type sVar4;
  int iVar5;
  ostream *this;
  size_type sVar6;
  byte bVar7;
  uint uVar8;
  bool bVar9;
  ostringstream os;
  uint auStack_190 [50];
  undefined1 auStack_c8 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  lVar2 = *(long *)(_os + -0x18);
  std::ios::fill();
  auStack_c8[lVar2] = 0x30;
  *(uint *)((long)auStack_190 + *(long *)(_os + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(_os + -0x18)) & 0xffffffb5 | 8;
  pcVar3 = (value->_M_dataplus)._M_p;
  sVar4 = value->_M_string_length;
  for (sVar6 = 0; sVar4 != sVar6; sVar6 = sVar6 + 1) {
    bVar7 = pcVar3[sVar6];
    iVar5 = isalnum((int)(char)bVar7);
    if ((((iVar5 == 0) && (uVar8 = (uint)bVar7, 1 < bVar7 - 0x2d)) && (bVar7 != 0x5f)) &&
       ((bVar7 != 0x7e && (bVar9 = bVar7 != 0x2f, bVar7 = 0x2f, bVar9 || escape_slash)))) {
      puVar1 = (uint *)((long)auStack_190 + *(long *)(_os + -0x18));
      *puVar1 = *puVar1 | 0x4000;
      this = std::operator<<((ostream *)&os,'%');
      *(undefined8 *)(this + *(long *)(*(long *)this + -0x18) + 0x10) = 2;
      std::ostream::operator<<(this,uVar8);
      puVar1 = (uint *)((long)auStack_190 + *(long *)(_os + -0x18));
      *puVar1 = *puVar1 & 0xffffbfff;
    }
    else {
      std::operator<<((ostream *)&os,bVar7);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  return __return_storage_ptr__;
}

Assistant:

inline std::string url_encode(const std::string &value, bool escape_slash = true) {
  std::ostringstream os;
  os.fill('0');
  os << std::hex;
  for (char c : value) {
    if (isalnum(c) || c == '-' || c == '_' || c == '.' || c == '~') {
      os << c;
      continue;
    }
    if (!escape_slash && c == '/') {
      os << c;
      continue;
    }
    os << std::uppercase;
    os << '%' << std::setw(2) << int((unsigned char) c);
    os << std::nouppercase;
  }
  return os.str();
}